

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2Accessors(void)

{
  __type _Var1;
  string kPattern;
  RE2 re;
  string sStack_288;
  LogMessageFatal local_268;
  RE2 local_e8;
  
  std::__cxx11::string::string((string *)&sStack_288,"http://([^/]+)/.*",(allocator *)&local_268);
  RE2::RE2(&local_e8,&sStack_288);
  _Var1 = std::operator==(&sStack_288,&local_e8.pattern_);
  if (!_Var1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41e);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                    "Check failed: (kPattern) == (re.pattern())");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  RE2::~RE2(&local_e8);
  std::__cxx11::string::~string((string *)&sStack_288);
  RE2::RE2(&local_e8,"foo");
  if ((local_e8.error_)->_M_string_length != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x424);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,"Check failed: re.error().empty()");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  if (local_e8.error_code_ != NoError) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x425);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal(&local_268);
    if (local_e8.error_code_ != NoError) {
      LogMessageFatal::LogMessageFatal
                (&local_268,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x426);
      std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                      "Check failed: re.error_code() == RE2::NoError");
      LogMessageFatal::~LogMessageFatal(&local_268);
    }
  }
  RE2::~RE2(&local_e8);
  return;
}

Assistant:

TEST(RE2, Accessors) {
  // Check the pattern() accessor
  {
    const string kPattern = "http://([^/]+)/.*";
    const RE2 re(kPattern);
    CHECK_EQ(kPattern, re.pattern());
  }

  // Check RE2 error field.
  {
    RE2 re("foo");
    CHECK(re.error().empty());  // Must have no error
    CHECK(re.ok());
    CHECK(re.error_code() == RE2::NoError);
  }
}